

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O1

bool isBinaryData(SmallBuffer *data)

{
  byte *pbVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  
  uVar2 = data->bufferSize;
  pbVar3 = data->heap;
  pbVar1 = pbVar3 + uVar2;
  pbVar4 = pbVar3;
  if (0 < (long)uVar2 >> 2) {
    pbVar4 = pbVar3 + (uVar2 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar2 >> 2) + 1;
    pbVar3 = pbVar3 + 3;
    do {
      if ((pbVar3[-3] == 0x22) || ((byte)(pbVar3[-3] + 0x81) < 0xa1)) {
        pbVar3 = pbVar3 + -3;
        goto LAB_001dcbdd;
      }
      if ((pbVar3[-2] == 0x22) || ((byte)(pbVar3[-2] + 0x81) < 0xa1)) {
        pbVar3 = pbVar3 + -2;
        goto LAB_001dcbdd;
      }
      if ((pbVar3[-1] == 0x22) || ((byte)(pbVar3[-1] + 0x81) < 0xa1)) {
        pbVar3 = pbVar3 + -1;
        goto LAB_001dcbdd;
      }
      if ((*pbVar3 == 0x22) || ((byte)(*pbVar3 + 0x81) < 0xa1)) goto LAB_001dcbdd;
      lVar5 = lVar5 + -1;
      pbVar3 = pbVar3 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar1 - (long)pbVar4;
  if (lVar5 != 1) {
    pbVar3 = pbVar4;
    if (lVar5 != 2) {
      pbVar3 = pbVar1;
      if ((lVar5 != 3) || (pbVar3 = pbVar4, (byte)(*pbVar4 + 0x81) < 0xa1 || *pbVar4 == 0x22))
      goto LAB_001dcbdd;
      pbVar3 = pbVar4 + 1;
    }
    if ((byte)(*pbVar3 + 0x81) < 0xa1 || *pbVar3 == 0x22) goto LAB_001dcbdd;
    pbVar4 = pbVar3 + 1;
  }
  pbVar3 = pbVar4;
  if (0xa0 < (byte)(*pbVar4 + 0x81) && *pbVar4 != 0x22) {
    pbVar3 = pbVar1;
  }
LAB_001dcbdd:
  return pbVar3 != pbVar1;
}

Assistant:

std::string_view to_string() const
    {
        return std::string_view{reinterpret_cast<const char*>(heap), bufferSize};
    }